

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O1

function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *
TasDREAM::getSpecifiedDomain
          (function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>
           *__return_storage_ptr__,int num_dimensions,void *domain_grid,double *domain_lower,
          double *domain_upper,tsg_dream_domain domain_callback)

{
  allocator_type local_4a;
  allocator_type local_49;
  vector<double,_std::allocator<double>_> local_48;
  vector<double,_std::allocator<double>_> local_30;
  
  if (domain_grid == (void *)0x0) {
    if (domain_upper == (double *)0x0) {
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(tsg_dream_domain *)&(__return_storage_ptr__->super__Function_base)._M_functor =
           domain_callback;
      __return_storage_ptr__->_M_invoker =
           std::
           _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:52:16)>
           ::_M_invoke;
      (__return_storage_ptr__->super__Function_base)._M_manager =
           std::
           _Function_handler<bool_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:52:16)>
           ::_M_manager;
    }
    else {
      std::vector<double,std::allocator<double>>::vector<double*,void>
                ((vector<double,std::allocator<double>> *)&local_30,domain_lower,
                 domain_lower + num_dimensions,&local_49);
      std::vector<double,std::allocator<double>>::vector<double*,void>
                ((vector<double,std::allocator<double>> *)&local_48,domain_upper,
                 domain_upper + num_dimensions,&local_4a);
      hypercube(__return_storage_ptr__,&local_30,&local_48);
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    TasGrid::TasmanianSparseGrid::getDomainInside
              (__return_storage_ptr__,(TasmanianSparseGrid *)domain_grid);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(const std::vector<double> &x)>
getSpecifiedDomain(int num_dimensions, void *domain_grid, double *domain_lower, double *domain_upper, tsg_dream_domain domain_callback){
    if (domain_grid != nullptr){
        return reinterpret_cast<TasGrid::TasmanianSparseGrid*>(domain_grid)->getDomainInside();
    }else if (domain_upper != nullptr){
        return hypercube(std::vector<double>(domain_lower, domain_lower + num_dimensions),
                         std::vector<double>(domain_upper, domain_upper + num_dimensions));
    }else{
        return [=](std::vector<double> const &x)->
        bool{
            return (domain_callback((int) x.size(), x.data()) != 0);
        };
    }
}